

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash.cpp
# Opt level: O0

void __thiscall NJamSpell::TPerfectHash::Dump(TPerfectHash *this,ostream *out)

{
  bool *args_4;
  phf *perfHash;
  ostream *out_local;
  TPerfectHash *this_local;
  
  args_4 = (bool *)this->Phf;
  NHandyPack::
  Dump<unsigned_long,phf::_unnamed_type_1_,unsigned_long,unsigned_long,unsigned_int,bool>
            (out,(unsigned_long *)(args_4 + 0x20),(anon_enum_32 *)(args_4 + 0x28),
             (unsigned_long *)(args_4 + 0x10),(unsigned_long *)(args_4 + 8),(uint *)(args_4 + 4),
             args_4);
  std::ostream::write((char *)out,*(long *)(args_4 + 0x18));
  return;
}

Assistant:

void TPerfectHash::Dump(std::ostream& out) const {
    const phf& perfHash = *(const phf*)Phf;
    NHandyPack::Dump(out, perfHash.d_max,
                         perfHash.g_op,
                         perfHash.m,
                         perfHash.r,
                         perfHash.seed,
                         perfHash.nodiv);
    out.write((const char*)perfHash.g, perfHash.r * sizeof(uint32_t));
}